

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

int pbrt::Clamp<int,int,int>(int val,int low,int high)

{
  int high_local;
  int low_local;
  int val_local;
  int local_4;
  
  local_4 = low;
  if ((low <= val) && (local_4 = val, high < val)) {
    local_4 = high;
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU inline constexpr T Clamp(T val, U low, V high) {
    if (val < low)
        return low;
    else if (val > high)
        return high;
    else
        return val;
}